

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_wstring.cpp
# Opt level: O3

ON_wString __thiscall ON_wString::Right(ON_wString *this,int count)

{
  int iVar1;
  long lVar2;
  int in_EDX;
  ON_Internal_Empty_wString *pOVar3;
  undefined4 in_register_00000034;
  
  ON_wString(this);
  lVar2 = *(long *)CONCAT44(in_register_00000034,count);
  pOVar3 = &empty_wstring;
  if (lVar2 != 0) {
    pOVar3 = (ON_Internal_Empty_wString *)(lVar2 + -0xc);
  }
  iVar1 = (pOVar3->header).string_length;
  if (iVar1 < in_EDX) {
    in_EDX = iVar1;
  }
  if (0 < in_EDX) {
    CopyToArray(this,in_EDX,(wchar_t *)(lVar2 + (long)(iVar1 - in_EDX) * 4));
  }
  return (ON_wString)(wchar_t *)this;
}

Assistant:

ON_wString ON_wString::Right(int count) const
{
  ON_wString s;
  if ( count > Length() )
    count = Length();
  if ( count > 0 ) {
    s.CopyToArray( count, &m_s[Length()-count] );
  }
  return s;
}